

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O0

Aig_Obj_t * Aig_CreateAnd(Aig_Man_t *p,int nVars)

{
  Aig_Obj_t *p1;
  undefined4 local_24;
  Aig_Obj_t *pAStack_20;
  int i;
  Aig_Obj_t *pFunc;
  int nVars_local;
  Aig_Man_t *p_local;
  
  pAStack_20 = Aig_ManConst1(p);
  for (local_24 = 0; local_24 < nVars; local_24 = local_24 + 1) {
    p1 = Aig_IthVar(p,local_24);
    pAStack_20 = Aig_And(p,pAStack_20,p1);
  }
  return pAStack_20;
}

Assistant:

Aig_Obj_t * Aig_CreateAnd( Aig_Man_t * p, int nVars )
{
    Aig_Obj_t * pFunc;
    int i;
    pFunc = Aig_ManConst1( p );
    for ( i = 0; i < nVars; i++ )
        pFunc = Aig_And( p, pFunc, Aig_IthVar(p, i) );
    return pFunc;
}